

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O1

bool __thiscall
ON_LocalZero1::BracketSpan(ON_LocalZero1 *this,double s0,double f0,double s1,double f1)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  bool bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  double in_XMM1_Qb;
  double fp;
  double fm;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  long lStack_50;
  double local_48;
  double dVar4;
  
  if ((this->m_k != (double *)0x0) && (2 < this->m_k_count)) {
    local_68 = f0;
    dStack_60 = in_XMM1_Qb;
    local_58 = s1;
    local_48 = f1;
    uVar7 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,s0);
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    uVar8 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,local_58);
    uVar7 = this->m_k_count - 1;
    if (this->m_k_count <= (int)uVar8) {
      uVar8 = uVar7;
    }
    uVar15 = (ulong)uVar8;
    if (-1 < (int)uVar8) {
      do {
        if ((this->m_k[uVar15] != local_58) || (NAN(this->m_k[uVar15]) || NAN(local_58)))
        goto LAB_005688cc;
        bVar5 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar5);
      uVar15 = 0xffffffff;
    }
LAB_005688cc:
    uVar8 = (int)uVar11 + 1;
    if ((int)uVar8 < (int)uVar7) {
      uVar8 = uVar7;
    }
    pdVar10 = this->m_k + uVar11 + 2;
    while (uVar12 = (int)uVar11 + 1, uVar11 = (ulong)uVar12, (int)uVar12 < (int)uVar7) {
      pdVar1 = pdVar10 + -1;
      dVar3 = *pdVar10;
      dVar4 = *pdVar10;
      pdVar10 = pdVar10 + 1;
      if ((*pdVar1 != dVar4) || (NAN(*pdVar1) || NAN(dVar3))) goto LAB_00568902;
    }
    uVar11 = (ulong)uVar8;
LAB_00568902:
    iVar13 = (int)uVar11;
    iVar14 = (int)uVar15;
    if (iVar13 <= iVar14) {
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[uVar11],this,&local_70,0,0xffffffff);
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[uVar11],this,&local_78,0,1);
      if (((local_68 <= 0.0) && (0.0 <= local_70)) || ((0.0 <= local_68 && (local_70 <= 0.0)))) {
        this->m_s1 = this->m_k[uVar11];
        this->m_f1 = local_70;
      }
      else {
        if ((0.0 < local_48) || (local_78 < 0.0)) {
          if (local_48 < 0.0) {
            return false;
          }
          if (0.0 < local_78) {
            return false;
          }
        }
        this->m_s0 = this->m_k[uVar11];
        this->m_f0 = local_78;
        if (iVar13 < iVar14) {
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[iVar14],this,&local_70,0,0xffffffff);
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[iVar14],this,&local_78,0,1);
          if (((local_48 <= 0.0) && (0.0 <= local_78)) || ((0.0 <= local_48 && (local_78 <= 0.0))))
          {
            this->m_s0 = this->m_k[iVar14];
            this->m_f0 = local_78;
          }
          else {
            if ((local_70 < 0.0 || 0.0 < local_68) && (local_68 < 0.0 || 0.0 < local_70)) {
              return false;
            }
            this->m_s1 = this->m_k[iVar14];
            this->m_f1 = local_70;
            if (iVar13 + 1 < iVar14) {
              local_58 = (double)-(ulong)(0.0 <= local_68);
              lStack_50 = -(ulong)(0.0 <= dStack_60);
              local_68 = (double)-(ulong)(local_68 <= 0.0);
              dStack_60 = (double)-(ulong)(dStack_60 <= 0.0);
              do {
                uVar7 = (int)uVar15 + (int)uVar11 >> 1;
                lVar16 = (long)(int)uVar7;
                (*this->_vptr_ON_LocalZero1[2])(this->m_k[lVar16],this,&local_70,0,0xffffffff);
                (*this->_vptr_ON_LocalZero1[2])(this->m_k[lVar16],this,&local_78,0,1);
                if (((-(ulong)(0.0 <= local_70) & (ulong)local_68 & 1) == 0) &&
                   ((-(ulong)(local_70 <= 0.0) & (ulong)local_58 & 1) == 0)) {
                  if ((local_78 < 0.0 || 0.0 < local_48) && (0.0 < local_78 || local_48 < 0.0)) {
                    return false;
                  }
                  pdVar10 = this->m_k;
                  this->m_s0 = pdVar10[lVar16];
                  this->m_f0 = local_78;
                  uVar9 = (long)this->m_k_count - 2;
                  uVar11 = (ulong)uVar7;
                  if ((int)uVar7 <= (int)uVar9) {
                    uVar11 = uVar9 & 0xffffffff;
                  }
                  do {
                    if ((long)uVar9 <= lVar16) goto LAB_00568c3d;
                    pdVar1 = pdVar10 + lVar16;
                    lVar2 = lVar16 + 1;
                    lVar6 = lVar16 + 1;
                  } while ((*pdVar1 == pdVar10[lVar6]) &&
                          (lVar16 = lVar2, !NAN(*pdVar1) && !NAN(pdVar10[lVar6])));
                  uVar11 = (ulong)((int)lVar2 - 1);
                }
                else {
                  pdVar10 = this->m_k;
                  this->m_s1 = pdVar10[lVar16];
                  this->m_f1 = local_70;
                  if ((int)uVar7 < 1) {
                    uVar15 = (ulong)uVar7;
                  }
                  else {
                    uVar15 = (ulong)uVar7;
                    do {
                      if ((pdVar10[uVar15 - 1] != pdVar10[uVar15]) ||
                         (NAN(pdVar10[uVar15 - 1]) || NAN(pdVar10[uVar15]))) goto LAB_00568c3d;
                      bVar5 = 1 < (long)uVar15;
                      uVar15 = uVar15 - 1;
                    } while (bVar5);
                    uVar15 = 0;
                  }
                }
LAB_00568c3d:
              } while ((int)uVar11 + 1 < (int)uVar15);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool
ON_LocalZero1::BracketSpan( double s0, double f0, double s1, double f1 )
{
  int i0, i1, i;
  double fm, fp;
  bool rc = true;
  if ( m_k && m_k_count >= 3 ) {
    i0 = ON_SearchMonotoneArray(m_k,m_k_count,s0);
    if ( i0 < 0 )
      i0 = 0;
    i1 = ON_SearchMonotoneArray(m_k,m_k_count,s1);
    if ( i1 >= m_k_count )
      i1 = m_k_count-1;
    while ( i1 >= 0 && s1 == m_k[i1] ) {
      i1--;
    }
    i0++;
    while ( i0 < m_k_count-1 && m_k[i0] == m_k[i0+1] )
      i0++;
    if ( i0 <= i1 ) {
      // we have s0 < m_k[i0] <= ... <= m_k[i1] < s1
      Evaluate( m_k[i0], &fm, nullptr,-1 ); // guard against C0 discontinuities
      Evaluate( m_k[i0], &fp, nullptr, 1 );
      if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
        m_s1 = m_k[i0];
        m_f1 = fm;
      }
      else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
        m_s0 = m_k[i0];
        m_f0 = fp;
        if ( i0 < i1 ) {
          Evaluate( m_k[i1], &fm, nullptr, -1 );
          Evaluate( m_k[i1], &fp, nullptr,  1 );
          if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
            m_s0 = m_k[i1];
            m_f0 = fp;
          }
          else if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
            m_s1 = m_k[i1];
            m_f1 = fm;
            // we have s0 = m_k[i0] < m_k[i1] = s1 and a bonafide sign change
            while (i0+1 < i1) {
              // bisect m_k[i0],...,m_k[i1] until we get a sign change between
              // m_k[i],m_k[i+1].  We need to do this in order to make sure
              // we are passing a C2 function to the repeated zero finders.
              i = (i0+i1)>>1;
              Evaluate( m_k[i], &fm, nullptr, -1 );
              Evaluate( m_k[i], &fp, nullptr,  1 );
              if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
                m_s1 = m_k[i];
                m_f1 = fm;
                i1 = i;
                while ( i1>0 && m_k[i1-1]==m_k[i1])
                  i1--;
              }
              else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
                m_s0 = m_k[i];
                m_f0 = fp;
                i0 = i;
                while ( i0 < m_k_count-2 && m_k[i0] == m_k[i0+1] )
                  i0++;
              }
              else {
                // discontinuous sign change across m_k[i]
                rc = false;
                break;
              }
            }
          }
          else {
            // discontinuous sign change across m_k[i1]
            rc = false;
          }
        }
      }
      else {
        // discontinuous sign change across m_k[i0]
        rc = false;
      }
    }
  }
  return rc;
}